

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O1

Pattern * trieste::T(Pattern *__return_storage_ptr__,Token *type)

{
  initializer_list<trieste::Token> __l;
  initializer_list<trieste::Token> __l_00;
  vector<trieste::Token,_std::allocator<trieste::Token>_> types;
  allocator_type local_fa;
  less<trieste::Token> local_f9;
  Token local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_f0;
  Token local_e8;
  PatternPtr local_e0;
  vector<trieste::Token,_std::allocator<trieste::Token>_> local_d0;
  set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> local_b8;
  undefined1 local_88 [104];
  
  local_f8 = (Token)type->def;
  __l._M_len = 1;
  __l._M_array = &local_f8;
  std::vector<trieste::Token,_std::allocator<trieste::Token>_>::vector
            (&local_d0,__l,(allocator_type *)&local_e8);
  local_f8.def = (TokenDef *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::TokenMatch,std::allocator<trieste::detail::TokenMatch>,std::vector<trieste::Token,std::allocator<trieste::Token>>&>
            (&_Stack_f0,(TokenMatch **)&local_f8,(allocator<trieste::detail::TokenMatch> *)&local_e8
             ,&local_d0);
  local_e0.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_f8.def;
  local_e0.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Stack_f0._M_pi;
  local_f8.def = (TokenDef *)0x0;
  _Stack_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_e8 = (Token)type->def;
  __l_00._M_len = 1;
  __l_00._M_array = &local_e8;
  std::set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>::set
            (&local_b8,__l_00,&local_f9,&local_fa);
  detail::FastPattern::match_token((FastPattern *)local_88,&local_b8);
  detail::Pattern::Pattern(__return_storage_ptr__,&local_e0,(FastPattern *)local_88);
  std::
  _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
  ::~_Rb_tree((_Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
               *)(local_88 + 0x30));
  std::
  _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
  ::~_Rb_tree((_Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
               *)local_88);
  std::
  _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
  ::~_Rb_tree((_Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
               *)&local_b8);
  if (local_e0.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_f0._M_pi);
  }
  if (local_d0.super__Vector_base<trieste::Token,_std::allocator<trieste::Token>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.super__Vector_base<trieste::Token,_std::allocator<trieste::Token>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d0.
                          super__Vector_base<trieste::Token,_std::allocator<trieste::Token>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.
                          super__Vector_base<trieste::Token,_std::allocator<trieste::Token>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

inline detail::Pattern T(const Token& type)
  {
    std::vector<Token> types = {type};
    return detail::Pattern(
      std::make_shared<detail::TokenMatch>(types),
      detail::FastPattern::match_token({type}));
  }